

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.cpp
# Opt level: O2

void __thiscall
qclab::qgates::RotationX<std::complex<float>_>::apply
          (RotationX<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  float fVar1;
  int iVar2;
  float c;
  ulong uVar3;
  anon_class_24_3_ec8a953c f;
  anon_class_24_3_ec8a953c local_40;
  
  iVar2 = (*(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  local_40.c = (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_;
  local_40.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  fVar1 = (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_;
  uVar3 = (ulong)(uint)fVar1;
  if (op != ConjTrans) {
    uVar3 = (ulong)(uint)fVar1 ^ (ulong)DAT_00114070;
  }
  local_40.s._M_value = uVar3 << 0x20;
  apply2<qclab::qgates::lambda_RotationX<std::complex<float>,float>(qclab::Op,float,float,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar2 + offset,&local_40);
  return;
}

Assistant:

void RotationX< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationX( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }